

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateStructForwardDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *title,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedStructs)

{
  size_type sVar1;
  string *psVar2;
  int iVar3;
  const_iterator cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Rb_tree_node_base *p_Var6;
  pointer pRVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer __k;
  char *__lhs;
  size_type *psVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  string structureType;
  string strippedValue;
  string str;
  size_type *local_178;
  size_type local_170;
  size_type local_168;
  undefined8 uStack_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  VulkanHppGenerator *local_b8;
  long *local_b0;
  size_type local_a8;
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  string *local_68;
  pointer local_60;
  pointer local_58;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
  *local_40;
  pointer local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pRVar7 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = this;
  local_70 = title;
  local_68 = __return_storage_ptr__;
  if (pRVar7 != local_60) {
    local_40 = &this->m_structs;
    local_48 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_50 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)listedStructs;
    do {
      __k = (pRVar7->types).
            super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pRVar7->types).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = pRVar7;
      if (__k != local_38) {
        do {
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                  ::find(&local_40->_M_t,&__k->name);
          if ((cVar4._M_node != local_48) &&
             (pVar11 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)listedStructs,&__k->name),
             ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
            local_178 = &local_168;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Vk","");
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,*(long *)(cVar4._M_node + 1),
                       (long)&(cVar4._M_node[1]._M_parent)->_M_color + *(long *)(cVar4._M_node + 1))
            ;
            sVar1 = local_170;
            psVar10 = local_178;
            if ((local_170 <= local_158._M_string_length) &&
               ((local_170 == 0 ||
                (iVar3 = bcmp(local_158._M_dataplus._M_p,local_178,local_170), iVar3 == 0)))) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                        (&local_158,0,sVar1);
              psVar10 = local_178;
            }
            if (psVar10 != &local_168) {
              operator_delete(psVar10,local_168 + 1);
            }
            __lhs = "  struct ";
            if (*(char *)((long)&cVar4._M_node[3]._M_left + 2) != '\0') {
              __lhs = "  union ";
            }
            std::operator+(&local_138,__lhs,&local_158);
            pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_138,";\n");
            local_178 = (size_type *)(pbVar5->_M_dataplus)._M_p;
            paVar8 = &pbVar5->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178 == paVar8) {
              local_168 = paVar8->_M_allocated_capacity;
              uStack_160 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              local_178 = &local_168;
            }
            else {
              local_168 = paVar8->_M_allocated_capacity;
            }
            local_170 = pbVar5->_M_string_length;
            (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar5->_M_string_length = 0;
            (pbVar5->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_90,(char *)local_178,local_170);
            if (local_178 != &local_168) {
              operator_delete(local_178,local_168 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            for (p_Var6 = cVar4._M_node[2]._M_right;
                p_Var6 != (_Rb_tree_node_base *)&cVar4._M_node[2]._M_parent;
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
              local_b0 = local_a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Vk","");
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,*(long *)(p_Var6 + 1),
                         (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
              sVar1 = local_a8;
              if ((local_a8 <= local_d8._M_string_length) &&
                 ((local_a8 == 0 ||
                  (iVar3 = bcmp(local_d8._M_dataplus._M_p,local_b0,local_a8), iVar3 == 0)))) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(&local_d8,0,sVar1);
              }
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_d8,0,0,"  using ",8);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar9 = &pbVar5->field_2;
              if (paVar8 == paVar9) {
                local_118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_118._M_dataplus._M_p = (pointer)paVar8;
              }
              local_118._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_118," = ");
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar9 = &pbVar5->field_2;
              if (paVar8 == paVar9) {
                local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_f8._M_dataplus._M_p = (pointer)paVar8;
              }
              local_f8._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_f8,local_158._M_dataplus._M_p,local_158._M_string_length);
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar9 = &pbVar5->field_2;
              if (paVar8 == paVar9) {
                local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_138._M_dataplus._M_p = (pointer)paVar8;
              }
              local_138._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_138,";\n");
              local_178 = (size_type *)(pbVar5->_M_dataplus)._M_p;
              paVar8 = &pbVar5->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178 == paVar8) {
                local_168 = paVar8->_M_allocated_capacity;
                uStack_160 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                local_178 = &local_168;
              }
              else {
                local_168 = paVar8->_M_allocated_capacity;
              }
              local_170 = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,(char *)local_178,local_170);
              if (local_178 != &local_168) {
                operator_delete(local_178,local_168 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_b0 != local_a0) {
                operator_delete(local_b0,local_a0[0] + 1);
              }
            }
            listedStructs =
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,
                              CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                       local_158.field_2._M_local_buf[0]) + 1);
              listedStructs =
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50;
            }
          }
          __k = __k + 1;
        } while (__k != local_38);
      }
      pRVar7 = local_58 + 1;
    } while (pRVar7 != local_60);
  }
  psVar2 = local_68;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  addTitleAndProtection(local_68,local_b8,local_70,&local_90,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

std::string VulkanHppGenerator::generateStructForwardDeclarations( std::vector<RequireData> const & requireData,
                                                                   std::string const &              title,
                                                                   std::set<std::string> &          listedStructs ) const
{
  std::string str;
  for ( auto const & require : requireData )
  {
    for ( auto const & type : require.types )
    {
      auto structIt = m_structs.find( type.name );
      if ( ( structIt != m_structs.end() ) && listedStructs.insert( type.name ).second )
      {
        std::string structureType = stripPrefix( structIt->first, "Vk" );
        str += ( structIt->second.isUnion ? "  union " : "  struct " ) + structureType + ";\n";

        for ( auto const & alias : structIt->second.aliases )
        {
          str += "  using " + stripPrefix( alias.first, "Vk" ) + " = " + structureType + ";\n";
        }
      }
    }
  }
  return addTitleAndProtection( title, str );
}